

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_equivalentUnitsWithImportUsingNonExistentUnits_Test::
~Units_equivalentUnitsWithImportUsingNonExistentUnits_Test
          (Units_equivalentUnitsWithImportUsingNonExistentUnits_Test *this)

{
  Units_equivalentUnitsWithImportUsingNonExistentUnits_Test *this_local;
  
  ~Units_equivalentUnitsWithImportUsingNonExistentUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, equivalentUnitsWithImportUsingNonExistentUnits)
{
    const std::string importModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"strange_units\">\n"
        "  <units name=\"strange_units\">\n"
        "    <unit units=\"my_units\"/>\n"
        "    <unit exponent=\"-1\" units=\"second\"/>\n"
        "  </units>\n"
        "</model>";
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"missing_unit_definition\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"strange_units.cellml\">\n"
        "    <units units_ref=\"strange_units\" name=\"strange_units\"/>\n"
        "  </import>\n"
        "</model>";

    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ParserPtr parser = libcellml::Parser::create();

    libcellml::ModelPtr model = parser->parseModel(modelString);
    libcellml::ModelPtr importModel = parser->parseModel(importModelString);

    libcellml::UnitsPtr units = libcellml::Units::create("kelvin");
    units->addUnit(libcellml::Units::StandardUnit::KELVIN);

    model->addUnits(units);

    importer->addModel(importModel, "strange_units.cellml");
    importer->resolveImports(model, ".");

    EXPECT_FALSE(libcellml::Units::compatible(model->units(0), units));
}